

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

int AF_A_JumpIfArmorType(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  bool bVar1;
  bool local_7b;
  FState *state_1;
  FState *state;
  AInventory *local_60;
  ABasicArmor *armor;
  void *pvStack_50;
  int amount;
  FState *label;
  AActor *pAStack_40;
  FName type;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x54b,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x54b,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  pAStack_40 = (AActor *)(param->field_0).field_1.a;
  local_7b = true;
  if (pAStack_40 != (AActor *)0x0) {
    local_7b = DObject::IsKindOf((DObject *)pAStack_40,AActor::RegistrationInfo.MyClass);
  }
  if (local_7b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x54b,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x54c,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type == '\0') {
    FName::FName((FName *)((long)&label + 4),param[1].field_0.i);
    this = pAStack_40;
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x54d,
                    "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    bVar1 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[2].field_0.field_1.atag != 7)) {
      bVar1 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (bVar1) {
      pvStack_50 = param[2].field_0.field_1.a;
      if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
        armor._4_4_ = 1;
      }
      else {
        if (param[3].field_0.field_3.Type != '\0') {
          __assert_fail("param[paramnum].Type == REGT_INT",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x54e,
                        "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)")
          ;
        }
        armor._4_4_ = param[3].field_0.i;
      }
      FName::FName((FName *)((long)&state + 4),NAME_BasicArmor);
      local_60 = AActor::FindInventory(this,(FName *)((long)&state + 4));
      if (((local_60 == (AInventory *)0x0) ||
          (bVar1 = FName::operator==((FName *)((long)&local_60[1].super_AActor.super_DThinker.
                                                      super_DObject.ObjNext + 4),
                                     (FName *)((long)&label + 4)), !bVar1)) ||
         (local_60->Amount < armor._4_4_)) {
        if (numret < 1) {
          stack_local._4_4_ = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                          ,0x556,
                          "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                         );
          }
          VMReturn::SetPointer(ret,(void *)0x0,7);
          stack_local._4_4_ = 1;
        }
      }
      else if (numret < 1) {
        stack_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                        ,0x554,
                        "int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)")
          ;
        }
        VMReturn::SetPointer(ret,pvStack_50,7);
        stack_local._4_4_ = 1;
      }
      return stack_local._4_4_;
    }
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x54d,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                ,0x54c,"int AF_A_JumpIfArmorType(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfArmorType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_NAME	 (type);
	PARAM_STATE	 (label);
	PARAM_INT_OPT(amount) { amount = 1; }

	ABasicArmor *armor = (ABasicArmor *)self->FindInventory(NAME_BasicArmor);

	if (armor && armor->ArmorType == type && armor->Amount >= amount)
	{
		ACTION_RETURN_STATE(label);
	}
	ACTION_RETURN_STATE(NULL);
}